

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O1

void __thiscall dg::pta::PSEquivalentNodesMerger::mergeCasts(PSEquivalentNodesMerger *this)

{
  PSNodeType PVar1;
  undefined8 *puVar2;
  PSNode *node1;
  pointer ppPVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nodeptr;
  undefined8 *puVar7;
  
  puVar7 = *(undefined8 **)(*(long *)this + 0x10);
  puVar2 = *(undefined8 **)(*(long *)this + 0x18);
  do {
    if (puVar7 == puVar2) {
      return;
    }
    node1 = (PSNode *)*puVar7;
    if (node1 != (PSNode *)0x0) {
      PVar1 = node1->type;
      if (PVar1 == GEP) {
        if (node1[1]._vptr_PSNode != (_func_int **)0x0) goto LAB_0010f69f;
      }
      else if (PVar1 != CAST) {
        if ((PVar1 != PHI) ||
           ((node1->super_SubgraphNode<dg::pta::PSNode>).operands.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (node1->super_SubgraphNode<dg::pta::PSNode>).operands.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start)) goto LAB_0010f69f;
        ppPVar3 = (node1->super_SubgraphNode<dg::pta::PSNode>).operands.
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar4 = (long)(node1->super_SubgraphNode<dg::pta::PSNode>).operands.
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3;
        if ((lVar4 != 0) && (uVar5 = lVar4 >> 3, 1 < uVar5)) {
          uVar6 = 1;
          do {
            if (*ppPVar3 != ppPVar3[uVar6]) goto LAB_0010f69f;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
      }
      merge(this,node1,
            *(node1->super_SubgraphNode<dg::pta::PSNode>).operands.
             super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
             super__Vector_impl_data._M_start);
    }
LAB_0010f69f:
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void PSEquivalentNodesMerger::mergeCasts() {
    for (const auto &nodeptr : G->getNodes()) {
        if (!nodeptr)
            continue;

        PSNode *node = nodeptr.get();

        // cast is always 'a proxy' to the real value,
        // it does not change the pointers
        if (node->getType() == PSNodeType::CAST ||
            (node->getType() == PSNodeType::PHI && node->getOperandsNum() > 0 &&
             allOperandsAreSame(node))) {
            merge(node, node->getOperand(0));
        } else if (PSNodeGep *GEP = PSNodeGep::get(node)) {
            if (GEP->getOffset().isZero()) // GEP with 0 offest is cast
                merge(node, GEP->getSource());
        }
    }
}